

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

void __thiscall tlx::Logger::~Logger(Logger *this)

{
  undefined *puVar1;
  char local_30;
  undefined7 uStack_2f;
  long local_20 [2];
  
  local_30 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_30,1);
  puVar1 = s_logger_output_hook;
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)puVar1 + 0x10))(puVar1,&local_30);
  if ((long *)CONCAT71(uStack_2f,local_30) != local_20) {
    operator_delete((long *)CONCAT71(uStack_2f,local_30),local_20[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

Logger::~Logger() {
    oss_ << '\n';
    (*s_logger_output_hook).append_log_line(oss_.str());
}